

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O1

ShaderResourceVariableDesc
Diligent::FindPipelineResourceLayoutVariable
          (PipelineResourceLayoutDesc *LayoutDesc,char *Name,SHADER_TYPE ShaderStage,
          char *CombinedSamplerSuffix)

{
  ShaderResourceVariableDesc *pSVar1;
  SHADER_TYPE SVar2;
  bool bVar3;
  char *in_RAX;
  undefined7 extraout_var;
  undefined4 in_register_00000014;
  ulong extraout_RDX;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  ShaderResourceVariableDesc SVar9;
  string msg;
  string local_50;
  
  uVar4 = CONCAT44(in_register_00000014,ShaderStage);
  bVar8 = LayoutDesc->NumVariables != 0;
  if (bVar8) {
    lVar7 = 0x18;
    uVar5 = 1;
    do {
      pSVar1 = LayoutDesc->Variables;
      in_RAX = (char *)(ulong)ShaderStage;
      if ((*(SHADER_TYPE *)((long)&pSVar1[-1].Name + lVar7) & ShaderStage) != SHADER_TYPE_UNKNOWN) {
        bVar3 = StreqSuff(Name,*(char **)((long)pSVar1 + lVar7 + -0x18),CombinedSamplerSuffix,false)
        ;
        in_RAX = (char *)CONCAT71(extraout_var,bVar3);
        uVar4 = extraout_RDX;
        if (bVar3) {
          lVar6 = lVar7;
          if ((uint)uVar5 < LayoutDesc->NumVariables) {
            do {
              if (((*(SHADER_TYPE *)((long)&LayoutDesc->Variables->Name + lVar6) & ShaderStage) !=
                   SHADER_TYPE_UNKNOWN) &&
                 (bVar3 = StreqSuff(Name,*(char **)((long)LayoutDesc->Variables + lVar6 + -8),
                                    CombinedSamplerSuffix,false), bVar3)) {
                FormatString<char[149]>
                          (&local_50,
                           (char (*) [149])
                           "There must be no variables with overlapping stages in Desc.ResourceLayout. This error should\'ve been caught by ValidatePipelineResourceLayoutDesc()."
                          );
                DebugAssertionFailed
                          (local_50._M_dataplus._M_p,"FindPipelineResourceLayoutVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x39c);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              uVar5 = uVar5 + 1;
              lVar6 = lVar6 + 0x10;
            } while (uVar5 < LayoutDesc->NumVariables);
          }
          in_RAX = *(char **)((long)pSVar1 + lVar7 + -0x18);
          uVar4 = *(ulong *)((long)&pSVar1[-1].Name + lVar7);
          break;
        }
      }
      lVar7 = lVar7 + 0x10;
      bVar8 = uVar5 < LayoutDesc->NumVariables;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  if (!bVar8) {
    SVar2 = LayoutDesc->DefaultVariableMergeStages;
    if ((LayoutDesc->DefaultVariableMergeStages & ShaderStage) == SHADER_TYPE_UNKNOWN) {
      SVar2 = ShaderStage;
    }
    uVar4 = uVar4 & 0xffff000000000000 | (ulong)SVar2 |
            (ulong)LayoutDesc->DefaultVariableType << 0x20;
    in_RAX = Name;
  }
  SVar9.ShaderStages = (int)uVar4;
  SVar9.Type = (char)(uVar4 >> 0x20);
  SVar9.Flags = (char)(uVar4 >> 0x28);
  SVar9._14_2_ = (short)(uVar4 >> 0x30);
  SVar9.Name = in_RAX;
  return SVar9;
}

Assistant:

ShaderResourceVariableDesc FindPipelineResourceLayoutVariable(
    const PipelineResourceLayoutDesc& LayoutDesc,
    const char*                       Name,
    SHADER_TYPE                       ShaderStage,
    const char*                       CombinedSamplerSuffix)
{
    for (Uint32 i = 0; i < LayoutDesc.NumVariables; ++i)
    {
        const ShaderResourceVariableDesc& Var = LayoutDesc.Variables[i];
        if ((Var.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var.Name, CombinedSamplerSuffix))
        {
#ifdef DILIGENT_DEBUG
            for (Uint32 j = i + 1; j < LayoutDesc.NumVariables; ++j)
            {
                const ShaderResourceVariableDesc& Var2 = LayoutDesc.Variables[j];
                VERIFY(!((Var2.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var2.Name, CombinedSamplerSuffix)),
                       "There must be no variables with overlapping stages in Desc.ResourceLayout. "
                       "This error should've been caught by ValidatePipelineResourceLayoutDesc().");
            }
#endif
            return Var;
        }
    }

    // Use default properties
    if (ShaderStage & LayoutDesc.DefaultVariableMergeStages)
        ShaderStage = LayoutDesc.DefaultVariableMergeStages;
    return {ShaderStage, Name, LayoutDesc.DefaultVariableType};
}